

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O3

optional<int>
slang::ast::bindArrayIndexSetter
          (ASTContext *context,Expression *keyExpr,Type *elementType,ExpressionSyntax *valueSyntax,
          SmallMap<int,_const_slang::ast::Expression_*,_8UL,_std::pair<const_int,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
          *indexMap,
          SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
          *indexSetters)

{
  undefined1 *this;
  char *pcVar1;
  undefined4 uVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  _Optional_base<int,_true,_true> _Var7;
  Expression *this_00;
  Diagnostic *this_01;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  byte bVar17;
  undefined1 auVar18 [16];
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff58;
  optional<int> index;
  Expression *local_78;
  ulong local_70;
  group15<boost::unordered::detail::foa::plain_integral> *local_68;
  locator res;
  
  _Var7._M_payload.super__Optional_payload_base<int> =
       (_Optional_payload<int,_true,_true,_true>)
       ASTContext::evalInteger(context,keyExpr,(bitmask<slang::ast::EvalFlags>)0x0);
  if (((ulong)_Var7._M_payload.super__Optional_payload_base<int> >> 0x20 & 1) == 0) {
LAB_00493fc6:
    uVar11 = 0;
    uVar9 = 0;
    uVar8 = 0;
  }
  else {
    uVar11 = 0;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = context;
    index.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
         (_Optional_base<int,_true,_true>)
         (_Optional_base<int,_true,_true>)_Var7._M_payload.super__Optional_payload_base<int>;
    this_00 = Expression::bindRValue
                        ((Expression *)elementType,(Type *)valueSyntax,(ExpressionSyntax *)0x0,
                         (SourceRange)(auVar5 << 0x40),(ASTContext *)0x0,in_stack_ffffffffffffff58);
    bVar6 = Expression::bad(this_00);
    uVar9 = 0;
    uVar8 = 0;
    if (!bVar6) {
      this = &(indexMap->super_Storage).field_0x88;
      local_68 = (group15<boost::unordered::detail::foa::plain_integral> *)
                 (long)_Var7._M_payload.super__Optional_payload_base<int>._M_payload;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_68;
      uVar11 = SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),0);
      uVar9 = uVar11 >> (indexMap->field_0x90 & 0x3f);
      uVar2 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[uVar11 & 0xff];
      local_70 = *(ulong *)&indexMap->field_0x98;
      uVar12 = 0;
      uVar8 = uVar9;
      do {
        pcVar1 = (char *)(*(long *)&indexMap->field_0xa0 + uVar8 * 0x10);
        cVar14 = (char)uVar2;
        auVar18[0] = -(*pcVar1 == cVar14);
        cVar15 = (char)((uint)uVar2 >> 8);
        auVar18[1] = -(pcVar1[1] == cVar15);
        cVar16 = (char)((uint)uVar2 >> 0x10);
        auVar18[2] = -(pcVar1[2] == cVar16);
        bVar17 = (byte)((uint)uVar2 >> 0x18);
        auVar18[3] = -(pcVar1[3] == bVar17);
        auVar18[4] = -(pcVar1[4] == cVar14);
        auVar18[5] = -(pcVar1[5] == cVar15);
        auVar18[6] = -(pcVar1[6] == cVar16);
        auVar18[7] = -(pcVar1[7] == bVar17);
        auVar18[8] = -(pcVar1[8] == cVar14);
        auVar18[9] = -(pcVar1[9] == cVar15);
        auVar18[10] = -(pcVar1[10] == cVar16);
        auVar18[0xb] = -(pcVar1[0xb] == bVar17);
        auVar18[0xc] = -(pcVar1[0xc] == cVar14);
        auVar18[0xd] = -(pcVar1[0xd] == cVar15);
        auVar18[0xe] = -(pcVar1[0xe] == cVar16);
        auVar18[0xf] = -(pcVar1[0xf] == bVar17);
        uVar10 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe);
        local_78 = this_00;
        if (uVar10 != 0) {
          lVar13 = *(long *)&indexMap->field_0xa8 + uVar8 * 0xf0;
          do {
            iVar3 = 0;
            if (uVar10 != 0) {
              for (; (uVar10 >> iVar3 & 1) == 0; iVar3 = iVar3 + 1) {
              }
            }
            if (*(int *)(lVar13 + (ulong)(uint)(iVar3 << 4)) ==
                _Var7._M_payload.super__Optional_payload_base<int>._M_payload) {
              this_01 = ASTContext::addDiag(context,(DiagCode)0x110007,keyExpr->sourceRange);
              res.pg = local_68;
              std::
              vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
              ::emplace_back<long>(&this_01->args,(long *)&res);
              Diagnostic::addNote(this_01,(DiagCode)0xa0001,
                                  *(SourceRange *)
                                   (*(long *)(lVar13 + (ulong)(uint)(iVar3 << 4) + 8) + 0x20));
              goto LAB_00493fc6;
            }
            uVar10 = uVar10 - 1 & uVar10;
          } while (uVar10 != 0);
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar11 & 7] & pcVar1[0xf]) == 0)
        break;
        lVar13 = uVar8 + uVar12;
        uVar12 = uVar12 + 1;
        uVar8 = lVar13 + 1U & local_70;
      } while (uVar12 <= local_70);
      if (*(ulong *)&indexMap->field_0xb8 < *(ulong *)&indexMap->field_0xb0) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<int,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<int,void>,std::equal_to<int>,slang::detail::hashing::StackAllocator<std::pair<int_const,slang::ast::Expression_const*>,128ul,16ul>>
        ::
        nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,int&,slang::ast::Expression_const*>
                  (&res,(table_core<boost::unordered::detail::foa::flat_map_types<int,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<int,void>,std::equal_to<int>,slang::detail::hashing::StackAllocator<std::pair<int_const,slang::ast::Expression_const*>,128ul,16ul>>
                         *)this,(arrays_type *)&indexMap->field_0x90,uVar9,uVar11,
                   (try_emplace_args_t *)&stack0xffffffffffffff5f,(int *)&index,&local_78);
        *(long *)&indexMap->field_0xb8 = *(long *)&indexMap->field_0xb8 + 1;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<int,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<int,void>,std::equal_to<int>,slang::detail::hashing::StackAllocator<std::pair<int_const,slang::ast::Expression_const*>,128ul,16ul>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,int&,slang::ast::Expression_const*>
                  (&res,(table_core<boost::unordered::detail::foa::flat_map_types<int,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<int,void>,std::equal_to<int>,slang::detail::hashing::StackAllocator<std::pair<int_const,slang::ast::Expression_const*>,128ul,16ul>>
                         *)this,uVar11,(try_emplace_args_t *)&stack0xffffffffffffff5f,(int *)&index,
                   &local_78);
      }
      res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)keyExpr;
      res._8_8_ = this_00;
      SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>::
      emplace_back<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
                (indexSetters,(IndexSetter *)&res);
      uVar8 = (ulong)index.super__Optional_base<int,_true,_true>._M_payload.
                     super__Optional_payload_base<int> & 0xffffff0000000000;
      uVar11 = (ulong)index.super__Optional_base<int,_true,_true>._M_payload.
                      super__Optional_payload_base<int> & 0xff00000000;
      uVar9 = (ulong)index.super__Optional_base<int,_true,_true>._M_payload.
                     super__Optional_payload_base<int> & 0xffffffff;
    }
  }
  return (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)(uVar11 | uVar9 | uVar8);
}

Assistant:

static std::optional<int32_t> bindArrayIndexSetter(
    const ASTContext& context, const Expression& keyExpr, const Type& elementType,
    const ExpressionSyntax& valueSyntax, SmallMap<int32_t, const Expression*, 8>& indexMap,
    SmallVectorBase<StructuredAssignmentPatternExpression::IndexSetter>& indexSetters) {

    std::optional<int32_t> index = context.evalInteger(keyExpr);
    if (!index)
        return std::nullopt;

    auto& expr = Expression::bindRValue(elementType, valueSyntax, {}, context);
    if (expr.bad())
        return std::nullopt;

    auto [it, inserted] = indexMap.emplace(*index, &expr);
    if (!inserted) {
        auto& diag = context.addDiag(diag::AssignmentPatternKeyDupValue, keyExpr.sourceRange);
        diag << *index;
        diag.addNote(diag::NotePreviousDefinition, it->second->sourceRange);
        return std::nullopt;
    }

    indexSetters.push_back({&keyExpr, &expr});
    return index;
}